

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign.cpp
# Opt level: O0

int __thiscall
ncnn::ROIAlign::forward
          (ROIAlign *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  int *piVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar4;
  float v_1;
  float x_1;
  int bx_1;
  float y_1;
  int by_1;
  float sum_1;
  int pw_1;
  int ph_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  float count;
  int roi_bin_grid_w;
  int roi_bin_grid_h;
  float v;
  float x;
  int bx;
  float y;
  int by;
  float sum;
  int area;
  bool is_empty;
  int bin_grid_w;
  int bin_grid_h;
  float wend;
  float hend;
  float wstart;
  float hstart;
  int pw;
  int ph;
  float *outptr;
  float *ptr;
  int q;
  float bin_size_h;
  float bin_size_w;
  float roi_h;
  float roi_w;
  float roi_y2;
  float roi_x2;
  float roi_y1;
  float roi_x1;
  float *roi_ptr;
  Mat *top_blob;
  Mat *roi_blob;
  int channels;
  size_t elemsize;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffffd30;
  size_t in_stack_fffffffffffffd38;
  Mat *this_00;
  undefined8 in_stack_fffffffffffffd40;
  int _c;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  float fVar5;
  undefined3 uVar6;
  int in_stack_fffffffffffffd54;
  float in_stack_fffffffffffffd58;
  float in_stack_fffffffffffffd5c;
  float local_274;
  int local_270;
  float local_26c;
  int local_268;
  float local_264;
  int local_260;
  int local_25c;
  Mat local_258;
  float *local_210;
  Mat local_208;
  float *local_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  float local_1ac;
  int local_1a8;
  int local_1a4;
  float local_1a0;
  float local_19c;
  int local_198;
  float local_194;
  int local_190;
  float local_18c;
  int local_188;
  byte local_181;
  int local_180;
  int local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  int local_148;
  int local_144;
  Mat local_140;
  float *local_f8;
  Mat local_e0;
  float *local_98;
  int local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float *local_60;
  reference local_58;
  const_reference local_50;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  _c = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->w;
  local_38 = local_30->h;
  local_40 = local_30->elemsize;
  local_44 = local_30->c;
  local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                    in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48,_c,in_stack_fffffffffffffd38
                    ,(Allocator *)in_stack_fffffffffffffd30);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd30);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_60 = ncnn::Mat::operator_cast_to_float_(local_50);
    local_64 = *local_60 * *(float *)(in_RDI + 0xd8);
    local_68 = local_60[1] * *(float *)(in_RDI + 0xd8);
    local_6c = local_60[2] * *(float *)(in_RDI + 0xd8);
    local_70 = local_60[3] * *(float *)(in_RDI + 0xd8);
    if ((*(byte *)(in_RDI + 0xe0) & 1) != 0) {
      local_64 = local_64 - 0.5;
      local_68 = local_68 - 0.5;
      local_6c = local_6c - 0.5;
      local_70 = local_70 - 0.5;
    }
    local_74 = local_6c - local_64;
    local_78 = local_70 - local_68;
    if ((*(byte *)(in_RDI + 0xe0) & 1) == 0) {
      local_7c = 1.0;
      pfVar2 = std::max<float>(&local_74,&local_7c);
      local_74 = *pfVar2;
      local_80 = 1.0;
      pfVar2 = std::max<float>(&local_78,&local_80);
      local_78 = *pfVar2;
    }
    local_84 = local_74 / (float)*(int *)(in_RDI + 0xd0);
    local_88 = local_78 / (float)*(int *)(in_RDI + 0xd4);
    if (*(int *)(in_RDI + 0xe4) == 0) {
      for (local_8c = 0; local_8c < local_44; local_8c = local_8c + 1) {
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_stack_fffffffffffffd54);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_e0);
        ncnn::Mat::~Mat((Mat *)0x6f60a4);
        local_98 = pfVar2;
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_stack_fffffffffffffd54);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_140);
        ncnn::Mat::~Mat((Mat *)0x6f60f0);
        local_f8 = pfVar2;
        for (local_144 = 0; local_144 < *(int *)(in_RDI + 0xd4); local_144 = local_144 + 1) {
          for (local_148 = 0; local_148 < *(int *)(in_RDI + 0xd0); local_148 = local_148 + 1) {
            local_14c = local_68 + (float)local_144 * local_88;
            local_150 = local_64 + (float)local_148 * local_84;
            local_154 = local_68 + (float)(local_144 + 1) * local_88;
            local_158 = local_64 + (float)(local_148 + 1) * local_84;
            local_15c = 0.0;
            pfVar2 = std::max<float>(&local_14c,&local_15c);
            local_160 = (float)local_38;
            pfVar2 = std::min<float>(pfVar2,&local_160);
            local_14c = *pfVar2;
            local_164 = 0.0;
            pfVar2 = std::max<float>(&local_150,&local_164);
            local_168 = (float)local_34;
            pfVar2 = std::min<float>(pfVar2,&local_168);
            local_150 = *pfVar2;
            local_16c = 0.0;
            pfVar2 = std::max<float>(&local_154,&local_16c);
            local_170 = (float)local_38;
            pfVar2 = std::min<float>(pfVar2,&local_170);
            local_154 = *pfVar2;
            local_174 = 0.0;
            pfVar2 = std::max<float>(&local_158,&local_174);
            local_178 = (float)local_34;
            pfVar2 = std::min<float>(pfVar2,&local_178);
            local_158 = *pfVar2;
            if (*(int *)(in_RDI + 0xdc) < 1) {
              dVar4 = std::ceil((double)(ulong)(uint)(local_154 - local_14c));
              in_stack_fffffffffffffd5c = SUB84(dVar4,0);
            }
            else {
              in_stack_fffffffffffffd5c = (float)*(int *)(in_RDI + 0xdc);
            }
            local_17c = (int)in_stack_fffffffffffffd5c;
            if (*(int *)(in_RDI + 0xdc) < 1) {
              dVar4 = std::ceil((double)(ulong)(uint)(local_158 - local_150));
              in_stack_fffffffffffffd58 = SUB84(dVar4,0);
            }
            else {
              in_stack_fffffffffffffd58 = (float)*(int *)(in_RDI + 0xdc);
            }
            local_180 = (int)in_stack_fffffffffffffd58;
            uVar6 = (undefined3)in_stack_fffffffffffffd54;
            in_stack_fffffffffffffd54 = CONCAT13(1,uVar6);
            if (local_14c < local_154) {
              in_stack_fffffffffffffd54 = CONCAT13(local_158 <= local_150,uVar6);
            }
            local_181 = (byte)((uint)in_stack_fffffffffffffd54 >> 0x18);
            local_188 = local_17c * local_180;
            local_18c = 0.0;
            for (local_190 = 0; local_190 < local_17c; local_190 = local_190 + 1) {
              local_194 = local_14c + (((float)local_190 + 0.5) * local_88) / (float)local_17c;
              for (local_198 = 0; local_198 < local_180; local_198 = local_198 + 1) {
                local_19c = local_150 + (((float)local_198 + 0.5) * local_84) / (float)local_180;
                local_1a0 = bilinear_interpolate(local_98,local_34,local_38,local_19c,local_194);
                local_18c = local_1a0 + local_18c;
              }
            }
            if ((local_181 & 1) == 0) {
              fVar5 = local_18c / (float)local_188;
            }
            else {
              fVar5 = 0.0;
            }
            local_f8[local_148] = fVar5;
          }
          local_f8 = local_f8 + *(int *)(in_RDI + 0xd0);
        }
      }
    }
    else if (*(int *)(in_RDI + 0xe4) == 1) {
      if (*(int *)(in_RDI + 0xdc) < 1) {
        dVar4 = std::ceil((double)(ulong)(uint)(local_78 / (float)*(int *)(in_RDI + 0xd4)));
        fVar5 = SUB84(dVar4,0);
      }
      else {
        fVar5 = (float)*(int *)(in_RDI + 0xdc);
      }
      local_1a4 = (int)fVar5;
      if (*(int *)(in_RDI + 0xdc) < 1) {
        dVar4 = std::ceil((double)(ulong)(uint)(local_74 / (float)*(int *)(in_RDI + 0xd0)));
        fVar5 = SUB84(dVar4,0);
      }
      else {
        fVar5 = (float)*(int *)(in_RDI + 0xdc);
      }
      local_1a8 = (int)fVar5;
      local_1b0 = local_1a4 * local_1a8;
      local_1b4 = 1;
      piVar3 = std::max<int>(&local_1b0,&local_1b4);
      local_1ac = (float)*piVar3;
      for (local_1b8 = 0; local_1b8 < local_44; local_1b8 = local_1b8 + 1) {
        this_00 = &local_208;
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_stack_fffffffffffffd54);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(this_00);
        ncnn::Mat::~Mat((Mat *)0x6f67e4);
        local_1c0 = pfVar2;
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                           in_stack_fffffffffffffd54);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_258);
        ncnn::Mat::~Mat((Mat *)0x6f682e);
        local_210 = pfVar2;
        for (local_25c = 0; local_25c < *(int *)(in_RDI + 0xd4); local_25c = local_25c + 1) {
          for (local_260 = 0; local_260 < *(int *)(in_RDI + 0xd0); local_260 = local_260 + 1) {
            local_264 = 0.0;
            for (local_268 = 0; local_268 < local_1a4; local_268 = local_268 + 1) {
              local_26c = local_68 + (float)local_25c * local_88 +
                          (((float)local_268 + 0.5) * local_88) / (float)local_1a4;
              for (local_270 = 0; local_270 < local_1a8; local_270 = local_270 + 1) {
                local_274 = local_64 + (float)local_260 * local_84 +
                            (((float)local_270 + 0.5) * local_84) / (float)local_1a8;
                if ((((-1.0 <= local_26c) && (local_26c <= (float)local_38)) && (-1.0 <= local_274))
                   && (local_274 <= (float)local_34)) {
                  if (local_26c <= 0.0) {
                    local_26c = 0.0;
                  }
                  if (local_274 <= 0.0) {
                    local_274 = 0.0;
                  }
                  fVar5 = bilinear_interpolate(local_1c0,local_34,local_38,local_274,local_26c);
                  local_264 = fVar5 + local_264;
                }
              }
            }
            local_210[local_260] = local_264 / local_1ac;
          }
          local_210 = local_210 + *(int *)(in_RDI + 0xd0);
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ROIAlign::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = roi_ptr[0] * spatial_scale;
    float roi_y1 = roi_ptr[1] * spatial_scale;
    float roi_x2 = roi_ptr[2] * spatial_scale;
    float roi_y2 = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_x1 -= 0.5f;
        roi_y1 -= 0.5f;
        roi_x2 -= 0.5f;
        roi_y2 -= 0.5f;
    }

    float roi_w = roi_x2 - roi_x1;
    float roi_h = roi_y2 - roi_y1;

    if (!aligned)
    {
        roi_w = std::max(roi_w, 1.f);
        roi_h = std::max(roi_h, 1.f);
    }

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    if (version == 0)
    {
        // original version
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_y1 + ph * bin_size_h;
                    float wstart = roi_x1 + pw * bin_size_w;
                    float hend = roi_y1 + (ph + 1) * bin_size_h;
                    float wend = roi_x1 + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)h);
                    wstart = std::min(std::max(wstart, 0.f), (float)w);
                    hend = std::min(std::max(hend, 0.f), (float)h);
                    wend = std::min(std::max(wend, 0.f), (float)w);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        float y = hstart + (by + 0.5f) * bin_size_h / (float)bin_grid_h;

                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            float x = wstart + (bx + 0.5f) * bin_size_w / (float)bin_grid_w;

                            // bilinear interpolate at (x,y)
                            float v = bilinear_interpolate(ptr, w, h, x, y);

                            sum += v;
                        }
                    }

                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_h / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_w / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float sum = 0.f;
                    for (int by = 0; by < roi_bin_grid_h; by++)
                    {
                        float y = roi_y1 + ph * bin_size_h + (by + 0.5f) * bin_size_h / (float)roi_bin_grid_h;

                        for (int bx = 0; bx < roi_bin_grid_w; bx++)
                        {
                            float x = roi_x1 + pw * bin_size_w + (bx + 0.5f) * bin_size_w / (float)roi_bin_grid_w;

                            if (y < -1.0 || y > h || x < -1.0 || x > w)
                            {
                                // empty
                                continue;
                            }
                            else
                            {
                                if (y <= 0) y = 0;
                                if (x <= 0) x = 0;

                                // bilinear interpolate at (x,y)
                                float v = bilinear_interpolate(ptr, w, h, x, y);
                                sum += v;
                            }
                        }
                    }
                    outptr[pw] = sum / count;
                }

                outptr += pooled_width;
            }
        }
    }

    return 0;
}